

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateSetObjectTypeFromInlineCache
          (Lowerer *this,Instr *instrToInsertBefore,RegOpnd *opndBase,RegOpnd *opndInlineCache,
          bool isTypeTagged)

{
  uint32 offset;
  RegOpnd *dst;
  IndirOpnd *pIVar1;
  IntConstOpnd *src2;
  IndirOpnd *memObjType;
  IntConstOpnd *constTypeTagComplement;
  IndirOpnd *memNewType;
  RegOpnd *regNewType;
  bool isTypeTagged_local;
  RegOpnd *opndInlineCache_local;
  RegOpnd *opndBase_local;
  Instr *instrToInsertBefore_local;
  Lowerer *this_local;
  
  dst = IR::RegOpnd::New(TyInt64,instrToInsertBefore->m_func);
  pIVar1 = IR::IndirOpnd::New(opndInlineCache,0,TyInt64,instrToInsertBefore->m_func,false);
  InsertMove(&dst->super_Opnd,&pIVar1->super_Opnd,instrToInsertBefore,true);
  if (isTypeTagged) {
    src2 = IR::IntConstOpnd::New(-5,TyInt64,instrToInsertBefore->m_func,true);
    InsertAnd(&dst->super_Opnd,&dst->super_Opnd,&src2->super_Opnd,instrToInsertBefore);
  }
  offset = Js::RecyclableObject::GetOffsetOfType();
  pIVar1 = IR::IndirOpnd::New(opndBase,offset,TyInt64,instrToInsertBefore->m_func,false);
  InsertMove(&pIVar1->super_Opnd,&dst->super_Opnd,instrToInsertBefore,true);
  return;
}

Assistant:

void
Lowerer::GenerateSetObjectTypeFromInlineCache(
    IR::Instr * instrToInsertBefore,
    IR::RegOpnd * opndBase,
    IR::RegOpnd * opndInlineCache,
    bool isTypeTagged)
{
    // regNewType = MOV [&(inlineCache->u.local.type)]
    IR::RegOpnd * regNewType = IR::RegOpnd::New(TyMachReg, instrToInsertBefore->m_func);
    IR::IndirOpnd * memNewType = IR::IndirOpnd::New(opndInlineCache, (int32)offsetof(Js::InlineCache, u.local.type), TyMachReg, instrToInsertBefore->m_func);
    InsertMove(regNewType, memNewType, instrToInsertBefore);

    // AND regNewType, ~InlineCacheAuxSlotTypeTag
    if (isTypeTagged)
    {
        // On 64-bit platforms IntConstOpnd isn't big enough to hold TyMachReg values.
        IR::IntConstOpnd * constTypeTagComplement = IR::IntConstOpnd::New(~InlineCacheAuxSlotTypeTag, TyMachReg, instrToInsertBefore->m_func, /* dontEncode = */ true);
        InsertAnd(regNewType, regNewType, constTypeTagComplement, instrToInsertBefore);
    }

    // MOV base->type, regNewType
    IR::IndirOpnd * memObjType = IR::IndirOpnd::New(opndBase, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, instrToInsertBefore->m_func);
    InsertMove(memObjType, regNewType, instrToInsertBefore);
}